

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O1

int32_t icu_63::RegexCImpl::appendReplacement
                  (RegularExpression *regexp,UChar *replacementText,int32_t replacementLength,
                  UChar **destBuf,int32_t *destCapacity,UErrorCode *status)

{
  int iVar1;
  UChar UVar2;
  bool bVar3;
  RegexMatcher *pRVar4;
  RegularExpression *pRVar5;
  UBool UVar6;
  int iVar7;
  int32_t iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined8 in_RAX;
  undefined4 extraout_var;
  long lVar13;
  UChar *dest;
  UChar *context;
  ulong uVar14;
  int32_t replIdx;
  UErrorCode tempStatus;
  int local_c0;
  int32_t local_bc;
  UChar *local_b8;
  UChar *local_b0;
  ulong local_a8;
  ulong local_a0;
  RegexMatcher *local_98;
  undefined4 local_8c;
  RegularExpression *local_88;
  UChar **local_80;
  UObject local_78;
  UnicodeString local_70;
  
  local_8c = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (((destCapacity != (int32_t *)0x0) && (*status == U_BUFFER_OVERFLOW_ERROR)) &&
     (*destCapacity == 0)) {
    *status = U_ZERO_ERROR;
    local_8c = 0;
  }
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if ((regexp == (RegularExpression *)0x0) || (regexp->fMagic != 0x72657870)) {
LAB_0015c9d1:
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    if ((regexp->fText != (UChar *)0x0) || (regexp->fOwnsText != '\0')) {
      if ((((destBuf == (UChar **)0x0) || (replacementText == (UChar *)0x0)) ||
          (replacementLength < -1)) ||
         ((destCapacity == (int32_t *)0x0 ||
          (((local_b0 = *destBuf, local_b0 == (UChar *)0x0 && (0 < *destCapacity)) ||
           (local_a8 = (ulong)*destCapacity, (long)local_a8 < 0)))))) goto LAB_0015c9d1;
      local_98 = regexp->fMatcher;
      if (local_98->fMatch != '\0') {
        local_c0 = replacementLength;
        if (replacementLength == -1) {
          local_c0 = u_strlen_63(replacementText);
        }
        pRVar4 = local_98;
        local_b8 = replacementText;
        local_80 = destBuf;
        if (regexp->fText == (UChar *)0x0) {
          local_70.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)((ulong)local_70.super_Replaceable.super_UObject._vptr_UObject._4_4_ << 0x20
                        );
          uVar12 = utext_extract_63(local_98->fInputText,local_98->fLastMatchEnd,
                                    local_98->fMatchStart,local_b0,(int32_t)local_a8,
                                    (UErrorCode *)&local_70);
          uVar14 = (ulong)uVar12;
        }
        else {
          if (local_98->fInputText->pFuncs->mapNativeIndexToUTF16 ==
              (UTextMapNativeIndexToUTF16 *)0x0) {
            iVar9 = (int)local_98->fMatchStart;
            iVar7 = (int)local_98->fLastMatchEnd;
          }
          else {
            local_70.super_Replaceable.super_UObject._vptr_UObject =
                 (UObject)((ulong)local_70.super_Replaceable.super_UObject._vptr_UObject._4_4_ <<
                          0x20);
            iVar7 = utext_extract_63(local_98->fInputText,0,local_98->fLastMatchEnd,(UChar *)0x0,0,
                                     (UErrorCode *)&local_70);
            destBuf = local_80;
            local_70.super_Replaceable.super_UObject._vptr_UObject =
                 (UObject)((ulong)local_70.super_Replaceable.super_UObject._vptr_UObject &
                          0xffffffff00000000);
            iVar8 = utext_extract_63(pRVar4->fInputText,pRVar4->fLastMatchEnd,pRVar4->fMatchStart,
                                     (UChar *)0x0,0,(UErrorCode *)&local_70);
            iVar9 = iVar8 + iVar7;
          }
          uVar14 = 0;
          if (iVar9 - iVar7 != 0 && iVar7 <= iVar9) {
            uVar14 = 0;
            do {
              if (uVar14 < local_a8) {
                local_b0[uVar14] = regexp->fText[(long)iVar7 + uVar14];
              }
              uVar14 = uVar14 + 1;
            } while ((uint)(iVar9 - iVar7) != uVar14);
          }
        }
        local_bc = 0;
        if (0 < local_c0) {
          local_78._vptr_UObject = (_func_int **)&PTR__UnicodeString_00252160;
          context = local_b8;
          local_88 = regexp;
          while (uVar12 = (uint)uVar14, *status < U_ILLEGAL_ARGUMENT_ERROR) {
            lVar13 = (long)local_bc;
            UVar2 = context[lVar13];
            iVar9 = local_bc + 1;
            if (UVar2 == L'$') {
              uVar10 = 0xffffffff;
              if (iVar9 < local_c0) {
                uVar10 = (uint)(ushort)local_b8[iVar9];
                if ((((uVar10 & 0xf800) == 0xd800) && (((ushort)local_b8[iVar9] >> 10 & 1) == 0)) &&
                   ((local_bc + 2 != local_c0 && (((ushort)local_b8[lVar13 + 2] & 0xfc00) == 0xdc00)
                    ))) {
                  uVar10 = uVar10 * 0x400 + (uint)(ushort)local_b8[lVar13 + 2] + 0xfca02400;
                }
              }
              local_bc = iVar9;
              UVar6 = u_isdigit_63(uVar10);
              pRVar5 = local_88;
              if (UVar6 == '\0') {
                if (uVar10 == 0x7b) {
                  local_70.super_Replaceable.super_UObject._vptr_UObject =
                       (UObject)(UObject)local_78._vptr_UObject;
                  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
                  iVar9 = local_bc + 1;
                  if ((iVar9 != local_c0 && (local_b8[local_bc] & 0xfc00U) == 0xd800) &&
                     ((local_b8[(long)local_bc + 1] & 0xfc00U) == 0xdc00)) {
                    iVar9 = local_bc + 2;
                  }
                  local_bc = iVar9;
                  local_a0 = 0;
                  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                    local_a0 = 0;
                    while (local_bc < local_c0) {
                      iVar9 = local_bc + 1;
                      uVar10 = (uint)(ushort)local_b8[local_bc];
                      if ((((uVar10 & 0xfc00) == 0xd800) && (iVar9 != local_c0)) &&
                         (((ushort)local_b8[(long)local_bc + 1] & 0xfc00) == 0xdc00)) {
                        uVar10 = (uint)(ushort)local_b8[local_bc] * 0x400 +
                                 (uint)(ushort)local_b8[(long)local_bc + 1] + 0xfca02400;
                        iVar9 = local_bc + 2;
                      }
                      local_bc = iVar9;
                      if (uVar10 - 0x31 < 9 || (uVar10 & 0xffffffdf) - 0x41 < 0x1a) {
                        UnicodeString::append(&local_70,uVar10);
                      }
                      else {
                        if (uVar10 == 0x7d) {
                          iVar8 = uhash_geti_63(pRVar5->fPat->fNamedCaptureMap,&local_70);
                          local_a0 = CONCAT44(extraout_var,iVar8);
                          if (iVar8 != 0) goto LAB_0015ce7b;
                          local_a0 = 0;
                        }
                        *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                      }
LAB_0015ce7b:
                      if ((uVar10 == 0x7d) || (U_ZERO_ERROR < *status)) goto LAB_0015cf2d;
                    }
                    *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                  }
LAB_0015cf2d:
                  context = local_b8;
                  UnicodeString::~UnicodeString(&local_70);
                }
                else {
                  *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                  local_a0 = 0;
                  context = local_b8;
                }
              }
              else {
                iVar9 = local_98->fPattern->fGroupMap->count;
                local_a0 = 0;
                iVar7 = 0;
                do {
                  lVar13 = (long)local_bc;
                  context = local_b8;
                  if (local_c0 <= local_bc) break;
                  uVar10 = (uint)(ushort)local_b8[lVar13];
                  if ((uVar10 & 0xf800) == 0xd800) {
                    if (((ushort)local_b8[lVar13] >> 10 & 1) == 0) {
                      if ((local_bc + 1 != local_c0) &&
                         (uVar11 = (uint)(ushort)local_b8[lVar13 + 1],
                         (local_b8[lVar13 + 1] & 0xfc00U) == 0xdc00)) {
                        uVar10 = uVar10 << 10;
LAB_0015cc7c:
                        uVar10 = uVar10 + uVar11 + 0xfca02400;
                      }
                    }
                    else if ((0 < local_bc) && ((local_b8[lVar13 + -1] & 0xfc00U) == 0xd800)) {
                      uVar11 = (uint)(ushort)local_b8[lVar13 + -1] << 10;
                      goto LAB_0015cc7c;
                    }
                  }
                  UVar6 = u_isdigit_63(uVar10);
                  context = local_b8;
                  if (UVar6 == '\0') break;
                  iVar8 = u_charDigitValue_63(uVar10);
                  uVar10 = iVar8 + (int)local_a0 * 10;
                  if (iVar9 < (int)uVar10) {
                    if (iVar7 == 0) {
                      *status = U_INDEX_OUTOFBOUNDS_ERROR;
                    }
                  }
                  else {
                    iVar1 = local_bc + 1;
                    if ((iVar1 != local_c0 && (local_b8[local_bc] & 0xfc00U) == 0xd800) &&
                       ((local_b8[(long)local_bc + 1] & 0xfc00U) == 0xdc00)) {
                      iVar1 = local_bc + 2;
                    }
                    local_bc = iVar1;
                    iVar7 = iVar7 + 1;
                    local_a0 = (ulong)uVar10;
                  }
                  context = local_b8;
                } while ((int)uVar10 <= iVar9);
              }
              destBuf = local_80;
              if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                dest = local_b0 + (int)uVar12;
                if (local_b0 == (UChar *)0x0) {
                  dest = (UChar *)0x0;
                }
                iVar8 = (int)local_a8 - uVar12;
                if (iVar8 < 1) {
                  iVar8 = 0;
                }
                iVar8 = uregex_group_63((URegularExpression *)local_88,(int32_t)local_a0,dest,iVar8,
                                        status);
                uVar12 = iVar8 + uVar12;
                if (*status == U_BUFFER_OVERFLOW_ERROR) {
                  *status = U_ZERO_ERROR;
                }
              }
              bVar3 = *status < U_ILLEGAL_ARGUMENT_ERROR;
              uVar14 = (ulong)uVar12;
            }
            else {
              if (UVar2 == L'\\') {
                if (local_c0 <= iVar9) {
                  bVar3 = false;
                  local_bc = iVar9;
                  goto LAB_0015cf91;
                }
                UVar2 = context[lVar13 + 1];
                local_bc = iVar9;
                if ((UVar2 & 0xffdfU) == 0x55) {
                  uVar10 = u_unescapeAt_63(uregex_ucstr_unescape_charAt_63,&local_bc,local_c0,
                                           context);
                  if (uVar10 != 0xffffffff) {
                    if ((int)uVar10 < 0x10000) {
                      if ((int)uVar12 < (int)local_a8) {
                        local_b0[(int)uVar12] = (UChar)uVar10;
                      }
                      uVar14 = (ulong)(uVar12 + 1);
                    }
                    else {
                      if ((int)uVar12 < (int)local_a8) {
                        local_b0[(int)uVar12] = (short)(uVar10 >> 10) + L'ퟀ';
                      }
                      if ((int)(uVar12 + 1) < (int)local_a8) {
                        local_b0[(int)(uVar12 + 1)] = (UChar)uVar10 & 0x3ffU | 0xdc00;
                      }
                      uVar14 = (ulong)(uVar12 + 2);
                    }
                  }
                  uVar12 = (uint)uVar14;
                  bVar3 = true;
                  if (uVar10 != 0xffffffff) goto LAB_0015cf91;
                }
                if ((int)uVar12 < (int)local_a8) {
                  local_b0[(int)uVar12] = UVar2;
                }
                local_bc = local_bc + 1;
              }
              else {
                local_bc = iVar9;
                if ((int)uVar12 < (int)local_a8) {
                  local_b0[(int)uVar12] = UVar2;
                }
              }
              uVar14 = (ulong)(uVar12 + 1);
              bVar3 = true;
            }
LAB_0015cf91:
            if ((!bVar3) || (local_c0 <= local_bc)) break;
          }
        }
        iVar9 = (int)uVar14;
        if (iVar9 < (int)local_a8) {
          local_b0[iVar9] = L'\0';
        }
        else if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          if (iVar9 == *destCapacity) {
            *status = U_STRING_NOT_TERMINATED_WARNING;
          }
          else {
            *status = U_BUFFER_OVERFLOW_ERROR;
          }
        }
        if ((0 < iVar9) && (iVar7 = *destCapacity, 0 < iVar7)) {
          if (iVar9 < (int)local_a8) {
            *destBuf = *destBuf + (uVar14 & 0xffffffff);
            iVar7 = iVar7 - iVar9;
          }
          else {
            *destBuf = *destBuf + local_a8;
            iVar7 = 0;
          }
          *destCapacity = iVar7;
        }
        if ((char)local_8c != '\0') {
          return iVar9;
        }
        if (U_ZERO_ERROR < *status) {
          return iVar9;
        }
        *status = U_BUFFER_OVERFLOW_ERROR;
        return iVar9;
      }
    }
    *status = U_REGEX_INVALID_STATE;
  }
  return 0;
}

Assistant:

int32_t RegexCImpl::appendReplacement(RegularExpression    *regexp,
                                      const UChar           *replacementText,
                                      int32_t                replacementLength,
                                      UChar                **destBuf,
                                      int32_t               *destCapacity,
                                      UErrorCode            *status)  {

    // If we come in with a buffer overflow error, don't suppress the operation.
    //  A series of appendReplacements, appendTail need to correctly preflight
    //  the buffer size when an overflow happens somewhere in the middle.
    UBool pendingBufferOverflow = FALSE;
    if (*status == U_BUFFER_OVERFLOW_ERROR && destCapacity != NULL && *destCapacity == 0) {
        pendingBufferOverflow = TRUE;
        *status = U_ZERO_ERROR;
    }

    //
    // Validate all paramters
    //
    if (validateRE(regexp, TRUE, status) == FALSE) {
        return 0;
    }
    if (replacementText == NULL || replacementLength < -1 ||
        destCapacity == NULL || destBuf == NULL ||
        (*destBuf == NULL && *destCapacity > 0) ||
        *destCapacity < 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    RegexMatcher *m = regexp->fMatcher;
    if (m->fMatch == FALSE) {
        *status = U_REGEX_INVALID_STATE;
        return 0;
    }

    UChar    *dest             = *destBuf;
    int32_t   capacity         = *destCapacity;
    int32_t   destIdx          =  0;
    int32_t   i;

    // If it wasn't supplied by the caller,  get the length of the replacement text.
    //   TODO:  slightly smarter logic in the copy loop could watch for the NUL on
    //          the fly and avoid this step.
    if (replacementLength == -1) {
        replacementLength = u_strlen(replacementText);
    }

    // Copy input string from the end of previous match to start of current match
    if (regexp->fText != NULL) {
        int32_t matchStart;
        int32_t lastMatchEnd;
        if (UTEXT_USES_U16(m->fInputText)) {
            lastMatchEnd = (int32_t)m->fLastMatchEnd;
            matchStart = (int32_t)m->fMatchStart;
        } else {
            // !!!: Would like a better way to do this!
            UErrorCode tempStatus = U_ZERO_ERROR;
            lastMatchEnd = utext_extract(m->fInputText, 0, m->fLastMatchEnd, NULL, 0, &tempStatus);
            tempStatus = U_ZERO_ERROR;
            matchStart = lastMatchEnd + utext_extract(m->fInputText, m->fLastMatchEnd, m->fMatchStart, NULL, 0, &tempStatus);
        }
        for (i=lastMatchEnd; i<matchStart; i++) {
            appendToBuf(regexp->fText[i], &destIdx, dest, capacity);
        }
    } else {
        UErrorCode possibleOverflowError = U_ZERO_ERROR; // ignore
        destIdx += utext_extract(m->fInputText, m->fLastMatchEnd, m->fMatchStart,
                                 dest==NULL?NULL:&dest[destIdx], REMAINING_CAPACITY(destIdx, capacity),
                                 &possibleOverflowError);
    }
    U_ASSERT(destIdx >= 0);

    // scan the replacement text, looking for substitutions ($n) and \escapes.
    int32_t  replIdx = 0;
    while (replIdx < replacementLength && U_SUCCESS(*status)) {
        UChar  c = replacementText[replIdx];
        replIdx++;
        if (c != DOLLARSIGN && c != BACKSLASH) {
            // Common case, no substitution, no escaping,
            //  just copy the char to the dest buf.
            appendToBuf(c, &destIdx, dest, capacity);
            continue;
        }

        if (c == BACKSLASH) {
            // Backslash Escape.  Copy the following char out without further checks.
            //                    Note:  Surrogate pairs don't need any special handling
            //                           The second half wont be a '$' or a '\', and
            //                           will move to the dest normally on the next
            //                           loop iteration.
            if (replIdx >= replacementLength) {
                break;
            }
            c = replacementText[replIdx];

            if (c==0x55/*U*/ || c==0x75/*u*/) {
                // We have a \udddd or \Udddddddd escape sequence.
                UChar32 escapedChar =
                    u_unescapeAt(uregex_ucstr_unescape_charAt,
                       &replIdx,                   // Index is updated by unescapeAt
                       replacementLength,          // Length of replacement text
                       (void *)replacementText);

                if (escapedChar != (UChar32)0xFFFFFFFF) {
                    if (escapedChar <= 0xffff) {
                        appendToBuf((UChar)escapedChar, &destIdx, dest, capacity);
                    } else {
                        appendToBuf(U16_LEAD(escapedChar), &destIdx, dest, capacity);
                        appendToBuf(U16_TRAIL(escapedChar), &destIdx, dest, capacity);
                    }
                    continue;
                }
                // Note:  if the \u escape was invalid, just fall through and
                //        treat it as a plain \<anything> escape.
            }

            // Plain backslash escape.  Just put out the escaped character.
            appendToBuf(c, &destIdx, dest, capacity);

            replIdx++;
            continue;
        }

        // We've got a $.  Pick up the following capture group name or number.
        // For numbers, consume only digits that produce a valid capture group for the pattern.

        int32_t groupNum  = 0;
        U_ASSERT(c == DOLLARSIGN);
        UChar32 c32 = -1;
        if (replIdx < replacementLength) {
            U16_GET(replacementText, 0, replIdx, replacementLength, c32);
        }
        if (u_isdigit(c32)) {
            int32_t numDigits = 0;
            int32_t numCaptureGroups = m->fPattern->fGroupMap->size();
            for (;;) {
                if (replIdx >= replacementLength) {
                    break;
                }
                U16_GET(replacementText, 0, replIdx, replacementLength, c32);
                if (u_isdigit(c32) == FALSE) {
                    break;
                }

                int32_t digitVal = u_charDigitValue(c32);
                if (groupNum * 10 + digitVal <= numCaptureGroups) {
                    groupNum = groupNum * 10 + digitVal;
                    U16_FWD_1(replacementText, replIdx, replacementLength);
                    numDigits++;
                } else {
                    if (numDigits == 0) {
                        *status = U_INDEX_OUTOFBOUNDS_ERROR;
                    }
                    break;
                }
            }
        } else if (c32 == LEFTBRACKET) {
            // Scan for Named Capture Group, ${name}.
            UnicodeString groupName;
            U16_FWD_1(replacementText, replIdx, replacementLength);
            while (U_SUCCESS(*status) && c32 != RIGHTBRACKET) { 
                if (replIdx >= replacementLength) {
                    *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                    break;
                }
                U16_NEXT(replacementText, replIdx, replacementLength, c32);
                if ((c32 >= 0x41 && c32 <= 0x5a) ||           // A..Z
                        (c32 >= 0x61 && c32 <= 0x7a) ||       // a..z
                        (c32 >= 0x31 && c32 <= 0x39)) {       // 0..9
                    groupName.append(c32);
                } else if (c32 == RIGHTBRACKET) {
                    groupNum = uhash_geti(regexp->fPat->fNamedCaptureMap, &groupName);
                    if (groupNum == 0) {
                        // Name not defined by pattern.
                        *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                    }
                } else {
                    // Character was something other than a name char or a closing '}'
                    *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                }
            }
        } else {
            // $ not followed by {name} or digits.
            *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
        }


        // Finally, append the capture group data to the destination.
        if (U_SUCCESS(*status)) {
            destIdx += uregex_group((URegularExpression*)regexp, groupNum,
                                    dest==NULL?NULL:&dest[destIdx], REMAINING_CAPACITY(destIdx, capacity), status);
            if (*status == U_BUFFER_OVERFLOW_ERROR) {
                // Ignore buffer overflow when extracting the group.  We need to
                //   continue on to get full size of the untruncated result.  We will
                //   raise our own buffer overflow error at the end.
                *status = U_ZERO_ERROR;
            }
        }

        if (U_FAILURE(*status)) {
            // bad group number or name.
            break;
        }
    }

    //
    //  Nul Terminate the dest buffer if possible.
    //  Set the appropriate buffer overflow or not terminated error, if needed.
    //
    if (destIdx < capacity) {
        dest[destIdx] = 0;
    } else if (U_SUCCESS(*status)) {
        if (destIdx == *destCapacity) {
            *status = U_STRING_NOT_TERMINATED_WARNING;
        } else {
            *status = U_BUFFER_OVERFLOW_ERROR;
        }
    }

    //
    // Return an updated dest buffer and capacity to the caller.
    //
    if (destIdx > 0 &&  *destCapacity > 0) {
        if (destIdx < capacity) {
            *destBuf      += destIdx;
            *destCapacity -= destIdx;
        } else {
            *destBuf      += capacity;
            *destCapacity =  0;
        }
    }

    // If we came in with a buffer overflow, make sure we go out with one also.
    //   (A zero length match right at the end of the previous match could
    //    make this function succeed even though a previous call had overflowed the buf)
    if (pendingBufferOverflow && U_SUCCESS(*status)) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    return destIdx;
}